

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O2

JL_STATUS ParseString(char *String,size_t StringLength,_Bool IsBareWord,_Bool AllowNewLines,
                     size_t *pAmountProcessed,char **pProcessedString)

{
  byte bVar1;
  char cVar2;
  JL_STATUS JVar3;
  char *pcVar4;
  undefined3 in_register_00000009;
  undefined7 in_register_00000011;
  long lVar5;
  ulong uVar6;
  size_t StringLength_00;
  char *StringLength_01;
  ulong uVar7;
  char *String_00;
  long lVar8;
  long lVar9;
  JL_STATUS local_78;
  uint32_t number;
  char *local_70;
  ulong *local_68;
  uint32_t lowSurrogate;
  uint local_54;
  char *local_50;
  char *local_48;
  ulong local_40;
  char **local_38;
  
  local_54 = CONCAT31(in_register_00000009,AllowNewLines);
  JVar3 = JL_STATUS_INVALID_DATA;
  if ((int)CONCAT71(in_register_00000011,IsBareWord) == 0) {
    lVar9 = 0;
    uVar7 = 1;
    while (uVar7 < StringLength) {
      cVar2 = String[uVar7];
      if (cVar2 == '\\') {
        uVar6 = uVar7 + 1;
        lVar5 = lVar9 + 1;
        if (((AllowNewLines) && (String[uVar6] == '\r')) && (String[uVar7 + 2] == '\n')) {
          uVar6 = uVar7 + 2;
          lVar5 = lVar9 + 2;
        }
      }
      else {
        if (cVar2 == (char)((*String == '\'') * '\x05' + '\"')) goto LAB_0011b6a5;
        uVar6 = uVar7;
        lVar5 = lVar9;
        if (cVar2 < ' ') {
          *pAmountProcessed = uVar7;
          return JL_STATUS_INVALID_DATA;
        }
      }
      lVar9 = lVar5 + 1;
      uVar7 = uVar6 + 1;
    }
  }
  else {
    lVar9 = 0;
    uVar7 = 0;
    JVar3 = JL_STATUS_INVALID_DATA;
    for (uVar6 = 0; uVar6 < StringLength; uVar6 = uVar6 + 1) {
      bVar1 = String[uVar6];
      uVar7 = uVar6;
      if ((bVar1 == 0x24) || (bVar1 == 0x5f)) {
LAB_0011b61f:
        JVar3 = JL_STATUS_SUCCESS;
      }
      else {
        if (bVar1 != 0x5c) {
          if (((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a))
          goto LAB_0011b61f;
          break;
        }
        lVar9 = lVar9 + 1;
        uVar6 = uVar6 + 1;
      }
      lVar9 = lVar9 + 1;
    }
    if (JVar3 == JL_STATUS_SUCCESS) {
LAB_0011b6a5:
      pcVar4 = (char *)WjTestLib_Calloc(lVar9 + 1,1);
      if (pcVar4 == (char *)0x0) {
        JVar3 = JL_STATUS_OUT_OF_MEMORY;
      }
      else {
        JVar3 = JL_STATUS_INVALID_DATA;
        lVar5 = 0;
        StringLength_00 = (size_t)local_54;
        uVar6 = (ulong)!IsBareWord;
        local_70 = pcVar4;
        local_68 = pAmountProcessed;
        local_40 = uVar6;
        local_38 = pProcessedString;
        for (; uVar6 < uVar7; uVar6 = uVar6 + 1) {
          if (String[uVar6] != '\\') {
            pcVar4[lVar5] = String[uVar6];
            lVar5 = lVar5 + 1;
            goto LAB_0011b84a;
          }
          cVar2 = String[uVar6 + 1];
          local_78 = JVar3;
          switch(cVar2) {
          case 'n':
            pcVar4[lVar5] = '\n';
            break;
          case 'o':
          case 'p':
          case 'q':
          case 's':
switchD_0011b763_caseD_6f:
            if (((char)StringLength_00 == '\0') || ((cVar2 != '\r' && (cVar2 != '\n')))) {
LAB_0011b964:
              *local_68 = uVar6;
              WjTestLib_Free(pcVar4);
              return local_78;
            }
            if (String[uVar6 + 2] == '\n' && cVar2 == '\r') {
              uVar6 = uVar6 + 1;
            }
            goto LAB_0011b847;
          case 'r':
            pcVar4[lVar5] = '\r';
            break;
          case 't':
            pcVar4[lVar5] = '\t';
            break;
          case 'u':
            if (~uVar6 + lVar9 < 4) goto LAB_0011b964;
            local_48 = String + uVar6;
            local_50 = local_48 + 2;
            local_78 = VerifyHexString(local_50,StringLength_00);
            pcVar4 = local_70;
            if (local_78 != JL_STATUS_SUCCESS) goto LAB_0011b964;
            number = 0;
            StringLength_01 = "%4x";
            __isoc99_sscanf(local_50,"%4x",&number);
            pcVar4 = local_70;
            if ((number & 0xfffffc00) == 0xd800) {
              local_78 = JVar3;
              if (((~uVar6 + lVar9 < 10) || (local_48[6] != '\\')) || (local_48[7] != 'u'))
              goto LAB_0011b964;
              String_00 = local_48 + 8;
              local_50 = (char *)(ulong)number;
              local_78 = VerifyHexString(String_00,(size_t)StringLength_01);
              pcVar4 = local_70;
              if (local_78 != JL_STATUS_SUCCESS) goto LAB_0011b964;
              _lowSurrogate = _lowSurrogate & 0xffffffff00000000;
              __isoc99_sscanf(String_00,"%4x",&lowSurrogate);
              pcVar4 = local_70;
              local_78 = JVar3;
              if ((lowSurrogate < 0xdc00) || (0xdfff < number)) goto LAB_0011b964;
              number = ((uint)local_50 & 0x3ff) * 0x400 + (lowSurrogate & 0x3ff) + 0x10000;
              lVar8 = 10;
            }
            else {
              lVar8 = 4;
              local_78 = JVar3;
              if ((number & 0xfffffc00) == 0xdc00) goto LAB_0011b964;
            }
            _lowSurrogate = 0;
            local_78 = JlUnicodeValueToUtf8(number,local_70 + lVar5,(size_t *)&lowSurrogate);
            pcVar4 = local_70;
            if (local_78 != JL_STATUS_SUCCESS) goto LAB_0011b964;
            lVar5 = lVar5 + _lowSurrogate;
            uVar6 = uVar6 + lVar8;
            StringLength_00 = (size_t)local_54;
            goto LAB_0011b847;
          default:
            if (cVar2 == '\"') {
              pcVar4[lVar5] = '\"';
            }
            else if (cVar2 == '\'') {
              pcVar4[lVar5] = '\'';
            }
            else if (cVar2 == '/') {
              pcVar4[lVar5] = '/';
            }
            else if (cVar2 == '\\') {
              pcVar4[lVar5] = '\\';
            }
            else if (cVar2 == 'b') {
              pcVar4[lVar5] = '\b';
            }
            else {
              if (cVar2 != 'f') goto switchD_0011b763_caseD_6f;
              pcVar4[lVar5] = '\f';
            }
          }
          lVar5 = lVar5 + 1;
LAB_0011b847:
          uVar6 = uVar6 + 1;
LAB_0011b84a:
        }
        *local_38 = pcVar4;
        *local_68 = uVar7 + local_40;
        JVar3 = JL_STATUS_SUCCESS;
      }
    }
  }
  return JVar3;
}

Assistant:

static
JL_STATUS
    ParseString
    (
        char const*         String,
        size_t              StringLength,
        bool                IsBareWord,
        bool                AllowNewLines,
        size_t*             pAmountProcessed,
        char**              pProcessedString
    )
{
    JL_STATUS jlStatus;
    size_t strLength = 0;
    size_t strEndPos = 0;
    char* processedString = NULL;
    bool singleQuoted = '\'' == String[0] ? true : false;

    // Find end of string
    jlStatus = JL_STATUS_INVALID_DATA;
    if( IsBareWord )
    {
        // Find length of bareword. Simply scan through until we find a non valid bareword char
        for( size_t i=0; i<StringLength; i++ )
        {
            strEndPos = i;
            if( '\\' == String[i] )
            {
                // Skip next character
                i += 1;
                strLength += 1;
            }
            else if ( '_' == String[i] || '$' == String[i]
                      || ( String[i] >= 'a' && String[i] <= 'z' )
                      || ( String[i] >= 'A' && String[i] <= 'Z' )
                      || ( String[i] >= '0' && String[i] <= '9' ) )
            {
                jlStatus = JL_STATUS_SUCCESS;   // At least one character
            }
            else
            {
                // End of bareword
                break;
            }
            strLength += 1;
        }
    }
    else
    {
        // Quoted string. Find the length
        for( size_t i=1; i<StringLength; i++ )      // Start at 1 to skip the first double quote
        {
            strEndPos = i;
            if( '\\' == String[i] )
            {
                // Skip next character
                i += 1;
                strLength += 1;
                if( AllowNewLines )
                {
                    // Check if we are escaping a crlf sequence
                    if( '\r' == String[i] && '\n' == String[i+1] )
                    {
                        i += 1;
                        strLength += 1;
                    }
                }
            }
            else if(    ( !singleQuoted && '\"' == String[i] )
                     || (  singleQuoted && '\'' == String[i] ) )
            {
                jlStatus = JL_STATUS_SUCCESS;
                break;
            }
            else if( String[i] < 32 )
            {
                // Control chars not allowed.
                jlStatus = JL_STATUS_INVALID_DATA;
                *pAmountProcessed = i;
                break;
            }
            strLength += 1;
        }
    }

    if( JL_STATUS_SUCCESS == jlStatus )
    {
        // Allocate space for processed string
        size_t strPos = 0;
        processedString = JlAlloc( strLength + 1 );
        if( NULL != processedString )
        {
            // Process string
            for( size_t i=IsBareWord?0:1; i<strEndPos; i++ )     // Skip first char which is double quote unless IsBareWord true
            {
                char currentChar = String[i];

                if( '\\' == currentChar )
                {
                    // Escaped chars. (There will definitely be at least one character after this
                    // due to the way we parsed in previous loop)
                    char nextChar = String[i+1];
                    char nextNextChar = String[i+2];
                    if( 'n' == nextChar )
                    {
                        processedString[strPos] = '\n';
                        strPos += 1;
                    }
                    else if( 'r' == nextChar )
                    {
                        processedString[strPos] = '\r';
                        strPos += 1;
                    }
                    else if( 'f' == nextChar )
                    {
                        processedString[strPos] = '\f';
                        strPos += 1;
                    }
                    else if( 'b' == nextChar )
                    {
                        processedString[strPos] = '\b';
                        strPos += 1;
                    }
                    else if( 't' == nextChar )
                    {
                        processedString[strPos] = '\t';
                        strPos += 1;
                    }
                    else if( '\\' == nextChar )
                    {
                        processedString[strPos] = '\\';
                        strPos += 1;
                    }
                    else if( '/' == nextChar )
                    {
                        processedString[strPos] = '/';
                        strPos += 1;
                    }
                    else if( '\"' == nextChar )
                    {
                        processedString[strPos] = '\"';
                        strPos += 1;
                    }
                    else if( '\'' == nextChar )
                    {
                        processedString[strPos] = '\'';
                        strPos += 1;
                    }
                    else if( 'u' == nextChar )
                    {
                        size_t numExtraCharsRead = 0;
                        // attempt to convert the escaped unicode value.
                        jlStatus = ConvertEscapedUnicode( String+i+2, strLength-i-1, processedString, &strPos, &numExtraCharsRead );
                        if( JL_STATUS_SUCCESS == jlStatus )
                        {
                            // skip the processed chars (note this is after the \u, we will also skip the \u part later)
                            // numCharsRead will be either 4 or 10 depending whether surrogate pairs were used/
                            i += numExtraCharsRead;
                        }
                        else
                        {
                            *pAmountProcessed = i;
                            break;
                        }
                    }
                    else if( AllowNewLines && ( '\r' == nextChar || '\n' == nextChar ) )
                    {
                        // Escaped new lines are allowed, they get discarded
                        if( '\r' == nextChar && '\n' == nextNextChar )
                        {
                            // the Windows CR/LF was escaped without a separate escape for the \n
                            i += 1;  // skip the extra one
                        }
                    }
                    else
                    {
                        // Invalid escape char
                        jlStatus = JL_STATUS_INVALID_DATA;
                        *pAmountProcessed = i;
                        break;
                    }
                    i += 1;  // Skip the char after the initial backslash as we have processed it
                }
                else
                {
                    processedString[strPos] = currentChar;
                    strPos += 1;
                }
            }

            if( JL_STATUS_SUCCESS == jlStatus )
            {
                *pProcessedString = processedString;
                *pAmountProcessed = strEndPos + (IsBareWord ? 0 : 1);     // If not bareword then also skip the ending quote
            }
            else
            {
                JlFree( processedString );
            }
        }
        else
        {
            jlStatus = JL_STATUS_OUT_OF_MEMORY;
        }
    }

    return jlStatus;
}